

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

int xsettingsd::GetPadding(int length,int increment)

{
  return (increment - length % increment) % increment;
}

Assistant:

int GetPadding(int length, int increment) {
  return (increment - (length % increment)) % increment;
  // From xsettings-common.h in Owen Taylor's reference implementation --
  // "n" is length and "m" is increment, I think.  This produces results
  // that don't seem like padding, though: when "n" is 2 and "m" is 4, it
  // produces 4.
  //return ((n + m - 1) & (~(m - 1)));
}